

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Holding.cpp
# Opt level: O1

void __thiscall Holding::PrintHolding(Holding *this)

{
  Holding **ppHVar1;
  Holding *pHVar2;
  Holding *pHVar3;
  int iVar4;
  ostream *poVar5;
  long *plVar6;
  string *psVar7;
  long lVar8;
  long *plVar9;
  char *pcVar10;
  Holding **ppHVar11;
  
  plVar9 = &std::cout;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Card: ",6);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->name)._M_dataplus._M_p,
                      (this->name)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cost: ",6);
  iVar4 = (*(this->super_BlackCard).super_Card._vptr_Card[4])(this);
  plVar6 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Holding Type: ",0xe);
  switch(this->typeH) {
  case PLAIN:
    pcVar10 = "Plain";
    goto LAB_0010c613;
  case MINE:
    pcVar10 = "Mine";
    lVar8 = 4;
    break;
  case GOLD_MINE:
    pcVar10 = "Gold Mine";
    lVar8 = 9;
    break;
  case CRYSTAL_MINE:
    pcVar10 = "Crystal Mine";
    lVar8 = 0xc;
    break;
  case FARMS:
    pcVar10 = "Farms";
LAB_0010c613:
    lVar8 = 5;
    break;
  case SOLO:
    pcVar10 = "Gifts and Favour";
    lVar8 = 0x10;
    break;
  default:
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar10,lVar8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  if (this->tapped == true) {
    pcVar10 = "Tapped: yes";
    lVar8 = 0xb;
  }
  else {
    pcVar10 = "Tapped: no";
    lVar8 = 10;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar10,lVar8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  if (this->revealed == true) {
    pcVar10 = "Revealed: yes";
    lVar8 = 0xd;
  }
  else {
    pcVar10 = "Revealed: no";
    lVar8 = 0xc;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar10,lVar8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Harvest Value: ",0xf);
  iVar4 = (*(this->super_BlackCard).super_Card._vptr_Card[7])(this);
  plVar6 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  pHVar2 = this->upperHolding;
  pHVar3 = this->subHolding;
  if (pHVar2 == (Holding *)0x0 && pHVar3 == (Holding *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Holding is not in a chain",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    plVar9 = (long *)std::ostream::flush();
    goto LAB_0010c91f;
  }
  ppHVar1 = &this->upperHolding;
  ppHVar11 = &this->subHolding;
  if (pHVar2 == (Holding *)0x0 || pHVar3 == (Holding *)0x0) {
    if (pHVar2 == (Holding *)0x0) {
      if (pHVar3->subHolding == (Holding *)0x0) {
        plVar6 = &std::cout;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Holding connected with the subHolding ",0x26);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Holding in complete chain with ",0x1f);
        psVar7 = BlackCard::getName_abi_cxx11_(&(*ppHVar11)->super_BlackCard);
        plVar6 = (long *)std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,(psVar7->_M_dataplus)._M_p,
                                    psVar7->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)plVar6,"and ",4);
        ppHVar11 = &(*ppHVar11)->subHolding;
      }
    }
    else {
      if (pHVar2->upperHolding == (Holding *)0x0) {
        plVar6 = &std::cout;
        pcVar10 = "Holding connected with the upperholding ";
        lVar8 = 0x28;
        goto LAB_0010c8d8;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Holding in complete chain with ",0x1f);
      psVar7 = BlackCard::getName_abi_cxx11_(&(*ppHVar1)->super_BlackCard);
      plVar6 = (long *)std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,(psVar7->_M_dataplus)._M_p,
                                  psVar7->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)plVar6,"and ",4);
      ppHVar11 = &(*ppHVar1)->upperHolding;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Holding in complete chain with ",0x1f);
    psVar7 = BlackCard::getName_abi_cxx11_(&(*ppHVar11)->super_BlackCard);
    plVar6 = (long *)std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(psVar7->_M_dataplus)._M_p,
                                psVar7->_M_string_length);
    pcVar10 = "and ";
    lVar8 = 4;
LAB_0010c8d8:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)plVar6,pcVar10,lVar8);
    ppHVar11 = ppHVar1;
  }
  psVar7 = BlackCard::getName_abi_cxx11_(&(*ppHVar11)->super_BlackCard);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)plVar6,(psVar7->_M_dataplus)._M_p,psVar7->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
LAB_0010c91f:
  std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
  std::ostream::put((char)plVar9);
  std::ostream::flush();
  return;
}

Assistant:

void Holding::PrintHolding()                  //prints holding's card stats
{
    cout << "Card: " << name << endl;
    cout << "Cost: " << getCost() << endl;

    cout << "Holding Type: ";
    if (typeH == PLAIN)
        cout << "Plain" << endl;
    else if (typeH == MINE)
        cout << "Mine" << endl;
    else if (typeH == GOLD_MINE)
        cout << "Gold Mine" << endl;
    else if (typeH == CRYSTAL_MINE)
        cout << "Crystal Mine" << endl;
    else if (typeH == FARMS)
        cout << "Farms" << endl;
    else if (typeH == SOLO)
        cout << "Gifts and Favour" << endl;
    else
        return;

    
    if (tapped)
        cout << "Tapped: yes" << endl;
    else
        cout << "Tapped: no" << endl;

    if (revealed)
        cout << "Revealed: yes" << endl;
    else
        cout << "Revealed: no" << endl;

    cout << "Harvest Value: " << getHarvestValue() << endl;

    if (!upperHolding && !subHolding)
    {
        cout << "Holding is not in a chain" << endl << endl;
        return;
    }
    if (upperHolding && subHolding)
        cout << "Holding in complete chain with "<< subHolding->getName() << "and " << upperHolding->getName() << endl;
    else if (upperHolding)
    {
        if (upperHolding->upperHolding)
            cout << "Holding in complete chain with "<< upperHolding->getName() << "and " << upperHolding->upperHolding->getName() << endl;
        else
            cout << "Holding connected with the upperholding " << upperHolding->getName() << endl;
    }
    else
    {
        if (subHolding->subHolding)
            cout << "Holding in complete chain with "<< subHolding->getName() << "and " << subHolding->subHolding->getName() << endl;
        else
            cout << "Holding connected with the subHolding " << subHolding->getName() << endl;
    }
    cout << endl;
}